

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O2

void __thiscall Fade::~Fade(Fade *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  pointer ppVar2;
  int **ppiVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__Fade_00152c70;
  pvVar1 = this->_ids;
  if (pvVar1 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) {
    ppVar2 = pvVar1[-1].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (ppVar2 != (pointer)0x0) {
      lVar5 = (long)ppVar2 * 0x18;
      do {
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   ((long)&pvVar1[-1].
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0);
    }
    operator_delete__(&pvVar1[-1].
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  uVar4 = _NUM_OF_ATTRIBUTES;
  for (uVar6 = 0; ppiVar3 = this->_aggregateRegister, uVar6 < uVar4; uVar6 = uVar6 + 1) {
    if (ppiVar3[uVar6] != (int *)0x0) {
      operator_delete__(ppiVar3[uVar6]);
      uVar4 = _NUM_OF_ATTRIBUTES;
    }
  }
  if (ppiVar3 != (int **)0x0) {
    operator_delete__(ppiVar3);
  }
  std::
  _Hashtable<std::vector<double,_std::allocator<double>_>,_std::pair<const_std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->_caches)._M_h);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Fade::~Fade()
{
    delete[] _ids;

    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
        delete[] _aggregateRegister[i];
    delete[] _aggregateRegister;
}